

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool ON_IsOrthonormalFrame(ON_2dVector *X,ON_2dVector *Y)

{
  bool bVar1;
  double dVar2;
  
  bVar1 = ON_IsOrthogonalFrame(X,Y);
  if ((bVar1) && (dVar2 = ON_2dVector::Length(X), ABS(dVar2 + -1.0) <= 1.490116119385e-08)) {
    dVar2 = ON_2dVector::Length(Y);
    return ABS(dVar2 + -1.0) <= 1.490116119385e-08;
  }
  return false;
}

Assistant:

bool ON_IsOrthonormalFrame( const ON_2dVector& X,  const ON_2dVector& Y )
{
  // returns true if X, Y, Z is an orthonormal frame
  if ( !ON_IsOrthogonalFrame( X, Y ) )
    return false;
  double x = X.Length();
  if ( fabs(x-1.0) >  ON_SQRT_EPSILON )
    return false;
  x = Y.Length();
  if ( fabs(x-1.0) >  ON_SQRT_EPSILON )
    return false;

  return true;
}